

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::ReplicatedAssignmentPatternSyntax::setChild
          (ReplicatedAssignmentPatternSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *pSVar2;
  logic_error *this_00;
  Token TVar3;
  ExpressionSyntax *local_168;
  string local_140;
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined8 local_68;
  Info *local_60;
  undefined8 local_58;
  Info *local_50;
  undefined8 local_48;
  Info *local_40;
  ExpressionSyntax *local_38;
  ExpressionSyntax *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  ReplicatedAssignmentPatternSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar3._0_8_;
    (this->openBrace).kind = (undefined2)local_28;
    (this->openBrace).field_0x2 = local_28._2_1_;
    (this->openBrace).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->openBrace).rawLen = local_28._4_4_;
    local_20 = TVar3.info;
    (this->openBrace).info = local_20;
    break;
  case 1:
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_168 = (ExpressionSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_168 = SyntaxNode::as<slang::syntax::ExpressionSyntax>(pSVar1);
    }
    local_38 = local_168;
    not_null<slang::syntax::ExpressionSyntax*>::not_null<slang::syntax::ExpressionSyntax*,void>
              ((not_null<slang::syntax::ExpressionSyntax*> *)&local_30,&local_38);
    (this->countExpr).ptr = local_30;
    break;
  case 2:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_48 = TVar3._0_8_;
    (this->innerOpenBrace).kind = (undefined2)local_48;
    (this->innerOpenBrace).field_0x2 = local_48._2_1_;
    (this->innerOpenBrace).numFlags = (NumericTokenFlags)local_48._3_1_;
    (this->innerOpenBrace).rawLen = local_48._4_4_;
    local_40 = TVar3.info;
    (this->innerOpenBrace).info = local_40;
    break;
  case 3:
    pSVar1 = TokenOrSyntax::node(&child);
    pSVar2 = SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>>
                       (pSVar1);
    SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::operator=(&this->items,pSVar2);
    break;
  case 4:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_58 = TVar3._0_8_;
    (this->innerCloseBrace).kind = (undefined2)local_58;
    (this->innerCloseBrace).field_0x2 = local_58._2_1_;
    (this->innerCloseBrace).numFlags = (NumericTokenFlags)local_58._3_1_;
    (this->innerCloseBrace).rawLen = local_58._4_4_;
    local_50 = TVar3.info;
    (this->innerCloseBrace).info = local_50;
    break;
  case 5:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_68 = TVar3._0_8_;
    (this->closeBrace).kind = (undefined2)local_68;
    (this->closeBrace).field_0x2 = local_68._2_1_;
    (this->closeBrace).numFlags = (NumericTokenFlags)local_68._3_1_;
    (this->closeBrace).rawLen = local_68._4_4_;
    local_60 = TVar3.info;
    (this->closeBrace).info = local_60;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_109);
    std::operator+(&local_e8,&local_108,":");
    std::__cxx11::to_string(&local_140,0x2b85);
    std::operator+(&local_c8,&local_e8,&local_140);
    std::operator+(&local_a8,&local_c8,": ");
    std::operator+(&local_88,&local_a8,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_88);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void ReplicatedAssignmentPatternSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openBrace = child.token(); return;
        case 1: countExpr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 2: innerOpenBrace = child.token(); return;
        case 3: items = child.node()->as<SeparatedSyntaxList<ExpressionSyntax>>(); return;
        case 4: innerCloseBrace = child.token(); return;
        case 5: closeBrace = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}